

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
          *this,char **key)

{
  char *pcVar1;
  long lVar2;
  ushort uVar3;
  bool bVar4;
  ushort uVar5;
  uint32_t uVar6;
  uint uVar7;
  size_t sVar8;
  CommonFields *common;
  PolicyFunctions *in_R9;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i match;
  char cVar12;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar13 [16];
  string_view v;
  FindInfo target;
  iterator iVar29;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  CommonFields *local_70;
  EqualElement<const_char_*> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  pcVar1 = *key;
  sVar8 = strlen(pcVar1);
  v._M_str = pcVar1;
  v._M_len = sVar8;
  common = (CommonFields *)StringHash::operator()((StringHash *)this,v);
  probe(&local_88,(CommonFields *)this,(size_t)common);
  lVar2 = *(long *)(this + 0x10);
  auVar10 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
  auVar10 = pshuflw(auVar10,auVar10,0);
  uVar9 = auVar10._0_4_;
  auVar10._4_4_ = uVar9;
  auVar10._0_4_ = uVar9;
  auVar10._8_4_ = uVar9;
  auVar10._12_4_ = uVar9;
  do {
    pcVar1 = (char *)(lVar2 + local_88.offset_);
    auVar11[0] = -(auVar10[0] == *pcVar1);
    auVar11[1] = -(auVar10[1] == pcVar1[1]);
    auVar11[2] = -(auVar10[2] == pcVar1[2]);
    auVar11[3] = -(auVar10[3] == pcVar1[3]);
    auVar11[4] = -(auVar10[4] == pcVar1[4]);
    auVar11[5] = -(auVar10[5] == pcVar1[5]);
    auVar11[6] = -(auVar10[6] == pcVar1[6]);
    auVar11[7] = -(auVar10[7] == pcVar1[7]);
    auVar11[8] = -(auVar10[8] == pcVar1[8]);
    auVar11[9] = -(auVar10[9] == pcVar1[9]);
    auVar11[10] = -(auVar10[10] == pcVar1[10]);
    auVar11[0xb] = -(auVar10[0xb] == pcVar1[0xb]);
    auVar11[0xc] = -(auVar10[0xc] == pcVar1[0xc]);
    auVar11[0xd] = -(auVar10[0xd] == pcVar1[0xd]);
    auVar11[0xe] = -(auVar10[0xe] == pcVar1[0xe]);
    auVar11[0xf] = -(auVar10[0xf] == pcVar1[0xf]);
    cVar12 = *pcVar1;
    cVar14 = pcVar1[1];
    cVar15 = pcVar1[2];
    cVar16 = pcVar1[3];
    cVar17 = pcVar1[4];
    cVar18 = pcVar1[5];
    cVar19 = pcVar1[6];
    cVar20 = pcVar1[7];
    cVar21 = pcVar1[8];
    cVar22 = pcVar1[9];
    cVar23 = pcVar1[10];
    cVar24 = pcVar1[0xb];
    cVar25 = pcVar1[0xc];
    cVar26 = pcVar1[0xd];
    cVar27 = pcVar1[0xe];
    cVar28 = pcVar1[0xf];
    for (uVar5 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
        ; uVar5 != 0; uVar5 = uVar5 - 1 & uVar5) {
      local_70 = common;
      local_58 = cVar12;
      cStack_57 = cVar14;
      cStack_56 = cVar15;
      cStack_55 = cVar16;
      cStack_54 = cVar17;
      cStack_53 = cVar18;
      cStack_52 = cVar19;
      cStack_51 = cVar20;
      cStack_50 = cVar21;
      cStack_4f = cVar22;
      cStack_4e = cVar23;
      cStack_4d = cVar24;
      cStack_4c = cVar25;
      cStack_4b = cVar26;
      cStack_4a = cVar27;
      cStack_49 = cVar28;
      local_48 = auVar10;
      uVar6 = TrailingZeros<unsigned_short>(uVar5);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar4 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>::EqualElement<char_const*>,std::pair<std::__cxx11::string_const,upb::generator::FieldClass>&>
                        (&local_68,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>
                          *)((local_88.offset_ + uVar6 & local_88.mask_) * 0x28 +
                            *(long *)(this + 0x18)));
      if (bVar4) {
        local_88.mask_ = uVar6 + local_88.offset_ & local_88.mask_;
        bVar4 = false;
        goto LAB_0023bbd3;
      }
      common = local_70;
      auVar10 = local_48;
      cVar12 = local_58;
      cVar14 = cStack_57;
      cVar15 = cStack_56;
      cVar16 = cStack_55;
      cVar17 = cStack_54;
      cVar18 = cStack_53;
      cVar19 = cStack_52;
      cVar20 = cStack_51;
      cVar21 = cStack_50;
      cVar22 = cStack_4f;
      cVar23 = cStack_4e;
      cVar24 = cStack_4d;
      cVar25 = cStack_4c;
      cVar26 = cStack_4b;
      cVar27 = cStack_4a;
      cVar28 = cStack_49;
    }
    auVar13[0] = -(cVar12 == -0x80);
    auVar13[1] = -(cVar14 == -0x80);
    auVar13[2] = -(cVar15 == -0x80);
    auVar13[3] = -(cVar16 == -0x80);
    auVar13[4] = -(cVar17 == -0x80);
    auVar13[5] = -(cVar18 == -0x80);
    auVar13[6] = -(cVar19 == -0x80);
    auVar13[7] = -(cVar20 == -0x80);
    auVar13[8] = -(cVar21 == -0x80);
    auVar13[9] = -(cVar22 == -0x80);
    auVar13[10] = -(cVar23 == -0x80);
    auVar13[0xb] = -(cVar24 == -0x80);
    auVar13[0xc] = -(cVar25 == -0x80);
    auVar13[0xd] = -(cVar26 == -0x80);
    auVar13[0xe] = -(cVar27 == -0x80);
    auVar13[0xf] = -(cVar28 == -0x80);
    uVar5 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
    if (uVar5 != 0) {
      bVar4 = ShouldInsertBackwardsForDebug
                        (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar4) {
        uVar3 = 0xf;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar7 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar7 = TrailingZeros<unsigned_short>(uVar5);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_88.index_;
      local_88.mask_ =
           PrepareInsertNonSoo((container_internal *)this,common,
                               uVar7 + local_88.offset_ & local_88.mask_,target,in_R9);
      bVar4 = true;
LAB_0023bbd3:
      iVar29 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
                              *)this,local_88.mask_);
      __return_storage_ptr__->first = iVar29;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    local_88.index_ = local_88.index_ + 0x10;
    local_88.offset_ = local_88.offset_ + local_88.index_ & local_88.mask_;
    if (*(ulong *)this < local_88.index_) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>, K = const char *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }